

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O1

bool __thiscall
road_network::in_between(road_network *this,node_type start,node_type stop,node_type q)

{
  node_type node;
  node_type *pnVar1;
  bool bVar2;
  road_network *this_00;
  deque<node_type,std::allocator<node_type>> *this_01;
  char cVar3;
  node_type *pnVar4;
  node_type n;
  vector<node_type,_std::allocator<node_type>_> vec;
  deque<node_type,_std::allocator<node_type>_> queue;
  node_type local_ae;
  node_type local_ad;
  uint local_ac;
  node_type *local_a8;
  node_type *local_a0;
  long local_98;
  road_network *local_90;
  _Deque_base<node_type,_std::allocator<node_type>_> local_88;
  
  this_00 = this;
  local_ae = stop;
  bVar2 = are_twins(this,start,q);
  if ((bVar2) || (bVar2 = are_twins(this_00,stop,q), bVar2)) {
    return false;
  }
  local_ac = (uint)start;
  bVar2 = are_twins(this_00,start,stop);
  if (stop == q) {
    return true;
  }
  if (start == q) {
    return true;
  }
  if (bVar2) {
    return true;
  }
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (node_type *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (node_type *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (node_type *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (node_type *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<node_type,_std::allocator<node_type>_>::_M_initialize_map(&local_88,0);
  local_90 = this;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<node_type,std::allocator<node_type>>::_M_push_back_aux<node_type_const&>
              ((deque<node_type,std::allocator<node_type>> *)&local_88,&local_ae);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_ae;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  do {
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00168b19;
    node = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_88._M_impl.super__Deque_impl_data._M_start._M_last =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    cVar3 = '\x01';
    if (node != q) {
      this_01 = (deque<node_type,std::allocator<node_type>> *)&local_a8;
      get_predecessors((vector<node_type,_std::allocator<node_type>_> *)this_01,local_90,node);
      pnVar1 = local_a0;
      for (pnVar4 = local_a8; pnVar4 != pnVar1; pnVar4 = pnVar4 + 1) {
        local_ad = *pnVar4;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          this_01 = (deque<node_type,std::allocator<node_type>> *)&local_88;
          std::deque<node_type,std::allocator<node_type>>::_M_push_back_aux<node_type_const&>
                    ((deque<node_type,std::allocator<node_type>> *)&local_88,&local_ad);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_ad;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      cVar3 = '\x03';
      if (*local_88._M_impl.super__Deque_impl_data._M_start._M_cur != start) {
        bVar2 = are_twins((road_network *)this_01,
                          *local_88._M_impl.super__Deque_impl_data._M_start._M_cur,
                          (node_type)local_ac);
        cVar3 = bVar2 * '\x03';
      }
      if (local_a8 != (node_type *)0x0) {
        operator_delete(local_a8,local_98 - (long)local_a8);
      }
    }
  } while (cVar3 == '\0');
  if (cVar3 == '\x03') {
LAB_00168b19:
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  std::_Deque_base<node_type,_std::allocator<node_type>_>::~_Deque_base(&local_88);
  return bVar2;
}

Assistant:

bool road_network::in_between(node_type start, node_type stop, node_type q)
{
    if(are_twins(start, q) || are_twins(stop, q))
    {
        return false;
    }

    if(are_twins(start, stop) || start == q || stop == q)
    {
        return true;
    }

    std::deque<node_type> queue;
    queue.push_back(stop);

    while(!queue.empty())
    {
        node_type current = queue.front();
        queue.pop_front();

        if (current == q)
        {
            return true;
        }

        std::vector<node_type> vec = get_predecessors(current);
        for(auto n : vec)
        {
            queue.push_back(n);
        }

        if (queue.front() == start || are_twins(queue.front(), start))
        {
            break;
        }
    }
    return false;
}